

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void InputTextReconcileUndoStateAfterUserCallback
               (ImGuiInputTextState *state,char *new_buf_a,int new_length_a)

{
  uint uVar1;
  unsigned_short *puVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  ImWchar *pIVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  
  pIVar3 = GImGui;
  puVar2 = (state->TextW).Data;
  uVar1 = state->CurLenW;
  uVar5 = ImTextCountCharsFromUtf8(new_buf_a,new_buf_a + new_length_a);
  iVar12 = uVar5 * 2 + 2;
  if ((pIVar3->TempBuffer).Capacity < iVar12) {
    pcVar6 = (pIVar3->TempBuffer).Data;
    if (pcVar6 != (char *)0x0) {
      ImGui::MemFree(pcVar6);
    }
    pcVar6 = (char *)ImGui::MemAlloc((long)iVar12);
    (pIVar3->TempBuffer).Data = pcVar6;
    (pIVar3->TempBuffer).Capacity = iVar12;
  }
  pIVar7 = (ImWchar *)(pIVar3->TempBuffer).Data;
  uVar14 = 0;
  ImTextStrFromUtf8(pIVar7,uVar5 + 1,new_buf_a,new_buf_a + new_length_a,(char **)0x0);
  uVar13 = uVar5;
  if ((int)uVar1 < (int)uVar5) {
    uVar13 = uVar1;
  }
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      if (puVar2[uVar14] != pIVar7[uVar14]) goto LAB_002206ee;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    uVar14 = (ulong)uVar13;
  }
LAB_002206ee:
  uVar13 = (uint)uVar14;
  if (uVar5 != uVar13 || uVar1 != uVar13) {
    lVar4 = 0;
    do {
      lVar11 = lVar4;
      if ((lVar11 + (int)uVar1 <= (long)(int)uVar13) || ((int)uVar5 + lVar11 <= (long)(int)uVar13))
      break;
      lVar4 = lVar11 + -1;
    } while (puVar2[(long)(int)uVar1 + lVar11 + -1] == pIVar7[(long)(int)uVar5 + lVar11 + -1]);
    uVar9 = (ulong)(~uVar13 + uVar1) + lVar11;
    iVar12 = (int)lVar11;
    iVar8 = (int)uVar9;
    if ((-1 < (int)(iVar12 + ~uVar13 + uVar5)) || (-1 < iVar8)) {
      pIVar7 = ImStb::stb_text_createundo
                         (&(state->Stb).undostate,uVar13,(uVar1 - uVar13) + iVar12,
                          (uVar5 - uVar13) + iVar12);
      if ((pIVar7 != (ImWchar *)0x0) && (-1 < iVar8)) {
        uVar10 = 0xffffffffffffffff;
        do {
          pIVar7[uVar10 + 1] = (state->TextW).Data[(uVar14 & 0xffffffff) + uVar10 + 1];
          uVar10 = uVar10 + 1;
        } while (uVar10 < (uVar9 & 0xffffffff));
      }
    }
  }
  return;
}

Assistant:

static void InputTextReconcileUndoStateAfterUserCallback(ImGuiInputTextState* state, const char* new_buf_a, int new_length_a)
{
    ImGuiContext& g = *GImGui;
    const ImWchar* old_buf = state->TextW.Data;
    const int old_length = state->CurLenW;
    const int new_length = ImTextCountCharsFromUtf8(new_buf_a, new_buf_a + new_length_a);
    g.TempBuffer.reserve_discard((new_length + 1) * sizeof(ImWchar));
    ImWchar* new_buf = (ImWchar*)(void*)g.TempBuffer.Data;
    ImTextStrFromUtf8(new_buf, new_length + 1, new_buf_a, new_buf_a + new_length_a);

    const int shorter_length = ImMin(old_length, new_length);
    int first_diff;
    for (first_diff = 0; first_diff < shorter_length; first_diff++)
        if (old_buf[first_diff] != new_buf[first_diff])
            break;
    if (first_diff == old_length && first_diff == new_length)
        return;

    int old_last_diff = old_length - 1;
    int new_last_diff = new_length - 1;
    for (; old_last_diff >= first_diff && new_last_diff >= first_diff; old_last_diff--, new_last_diff--)
        if (old_buf[old_last_diff] != new_buf[new_last_diff])
            break;

    const int insert_len = new_last_diff - first_diff + 1;
    const int delete_len = old_last_diff - first_diff + 1;
    if (insert_len > 0 || delete_len > 0)
        if (STB_TEXTEDIT_CHARTYPE* p = stb_text_createundo(&state->Stb.undostate, first_diff, delete_len, insert_len))
            for (int i = 0; i < delete_len; i++)
                p[i] = ImStb::STB_TEXTEDIT_GETCHAR(state, first_diff + i);
}